

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O2

void __thiscall Disa::Adjacency_Graph<false>::resize(Adjacency_Graph<false> *this,size_t *size)

{
  size_type __new_size;
  pointer puVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  pointer puVar2;
  long lVar3;
  const_iterator __last;
  long lVar4;
  ulong uVar5;
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  pVar6;
  ulong local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  puVar2 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = 0;
  if (puVar1 != puVar2) {
    uVar5 = ((long)puVar1 - (long)puVar2 >> 3) - 1;
  }
  local_38 = &this->offset;
  __new_size = *size + 1;
  if (uVar5 < *size) {
    if (puVar2 == puVar1) {
      local_40 = 0;
    }
    else {
      local_40 = puVar1[-1];
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (local_38,__new_size,&local_40);
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_38,__new_size);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->vertex_adjacent_list,
               (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1]);
    puVar2 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_40 = 0;
    lVar4 = 0;
    while( true ) {
      lVar3 = (long)(this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
      if ((lVar3 == 0) || ((lVar3 >> 3) - 1U <= local_40)) break;
      pVar6 = vertex_adjacency_iter(this,&local_40);
      __last._M_current = (unsigned_long *)pVar6.second._M_current;
      __first = std::
                __lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                          (pVar6.first._M_current._M_current,__last._M_current,size);
      if (__first._M_current == __last._M_current) {
        puVar2 = (local_38->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      }
      else {
        lVar3 = (long)__last._M_current - (long)__first._M_current >> 3;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                  (&this->vertex_adjacent_list,(const_iterator)__first._M_current,__last);
        puVar2 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar2[local_40 + 1] = puVar2[local_40 + 1] - lVar3;
        lVar4 = lVar4 + lVar3;
      }
      puVar2[local_40 + 2] = puVar2[local_40 + 2] - lVar4;
      local_40 = local_40 + 1;
    }
  }
  return;
}

Assistant:

void Adjacency_Graph<_directed>::resize(const std::size_t& size) {

  // Branch based on expansion or contraction of the graph.
  if(size_vertex() < size) {
    offset.resize(size + 1, offset.empty() ? 0 : offset.back());
  } else {
    // Resize the containers.
    offset.resize(size + 1);
    vertex_adjacent_list.resize(offset.back());

    // Loop over remaining vertices, looking for edges which no longer exist.
    std::size_t offset_carry = 0;
    FOR(i_vertex, size_vertex()) {
      auto [adjacency_begin, adjacency_end] = vertex_adjacency_iter(i_vertex);
      const auto erase_iter = std::lower_bound(adjacency_begin, adjacency_end, size);
      if(erase_iter != adjacency_end) {
        const auto offset_current = std::distance(erase_iter, adjacency_end);
        vertex_adjacent_list.erase(erase_iter, adjacency_end);
        offset[i_vertex + 1] -= offset_current;
        offset_carry += offset_current;
      }
      offset[i_vertex + 2] -= offset_carry;
    }
  }
}